

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,string *path_info,int32_t child_num,bool has_schnorr_pubkey)

{
  Privkey *this_00;
  ExtPrivkey *this_01;
  ExtPubkey *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__result;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  CfdException *pCVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  allocator local_1c1;
  string path_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  string hdkey_top;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path_list;
  string key;
  string key_info;
  string base_extkey_;
  ByteData local_48;
  
  Pubkey::Pubkey(&this->pubkey_);
  this_00 = &this->privkey_;
  Privkey::Privkey(this_00);
  this_01 = &this->extprivkey_;
  ExtPrivkey::ExtPrivkey(this_01);
  this_02 = &this->extpubkey_;
  ExtPubkey::ExtPubkey(this_02);
  __result = &this->path_;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ByteData::ByteData(&this->fingerprint_);
  ::std::__cxx11::string::string((string *)&key_info,(string *)path_info);
  if (*(path_info->_M_dataplus)._M_p == '[') {
    lVar4 = ::std::__cxx11::string::find((char *)path_info,0x4d44d3);
    if (lVar4 != -1) {
      ::std::__cxx11::string::substr((ulong)&path,(ulong)path_info);
      ::std::__cxx11::string::operator=((string *)&key_info,(string *)&path);
      ::std::__cxx11::string::~string((string *)&path);
      ::std::__cxx11::string::substr((ulong)&path,(ulong)path_info);
      lVar4 = ::std::__cxx11::string::find((char *)&path,0x4ae465);
      if (lVar4 != -1) {
        if (lVar4 != 0) {
          ::std::__cxx11::string::substr((ulong)&hdkey_top,(ulong)&path);
          ByteData::ByteData((ByteData *)&path_1,&hdkey_top);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&(this->fingerprint_).data_,&path_1);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&path_1);
          ::std::__cxx11::string::~string((string *)&hdkey_top);
        }
        ::std::__cxx11::string::substr((ulong)&hdkey_top,(ulong)&path);
        ::std::__cxx11::string::string((string *)&path_1,"KeyData",(allocator *)&base_extkey_);
        ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&key,&hdkey_top,
                          &path_1,'\0');
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(__result,&key);
        ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&key);
        ::std::__cxx11::string::~string((string *)&path_1);
        ::std::__cxx11::string::~string((string *)&hdkey_top);
      }
      ::std::__cxx11::string::~string((string *)&path);
    }
  }
  hdkey_top._M_dataplus._M_p = (pointer)&hdkey_top.field_2;
  hdkey_top._M_string_length = 0;
  hdkey_top.field_2._M_local_buf[0] = '\0';
  if (4 < key_info._M_string_length) {
    ::std::__cxx11::string::substr((ulong)&path,(ulong)&key_info);
    ::std::__cxx11::string::operator=((string *)&hdkey_top,(string *)&path);
    ::std::__cxx11::string::~string((string *)&path);
  }
  bVar1 = ::std::operator==(&hdkey_top,"pub");
  if (!bVar1) {
    bVar1 = ::std::operator==(&hdkey_top,"prv");
    if (!bVar1) {
      bVar1 = Privkey::HasWif(&key_info,(NetType *)0x0,(bool *)0x0);
      if (bVar1) {
        Privkey::FromWif((Privkey *)&path,&key_info,kCustomChain,true);
        Privkey::operator=(this_00,(Privkey *)&path);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&path);
        Privkey::GetPubkey((Pubkey *)&path,this_00);
        pbVar9 = &path;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,pbVar9);
      }
      else {
        ByteData::ByteData((ByteData *)&path_1,&key_info);
        bVar1 = Pubkey::IsValid((ByteData *)&path_1);
        if (bVar1) {
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_48.data_,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&path_1);
          Pubkey::Pubkey((Pubkey *)&path,&local_48);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&path);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&path);
          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
        }
        else if (has_schnorr_pubkey) {
          SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&path,(ByteData *)&path_1);
          SchnorrPubkey::CreatePubkey((Pubkey *)&key,(SchnorrPubkey *)&path,false);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&key);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
          pbVar9 = &path;
        }
        else {
          Privkey::Privkey((Privkey *)&path,(ByteData *)&path_1,kMainnet,true);
          Privkey::operator=(this_00,(Privkey *)&path);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&path);
          Privkey::GetPubkey((Pubkey *)&path,this_00);
          pbVar9 = &path;
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,pbVar9);
        }
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pbVar9);
        pbVar9 = &path_1;
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pbVar9);
      goto LAB_0037a362;
    }
  }
  path_1._M_dataplus._M_p = (pointer)&path_1.field_2;
  path_1._M_string_length = 0;
  path_1.field_2._M_local_buf[0] = '\0';
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&path,"/",(allocator *)&base_extkey_);
  StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&list,(string *)&key_info,(string *)&path);
  ::std::__cxx11::string::~string((string *)&path);
  ::std::__cxx11::string::_M_assign((string *)&key);
  if ((ulong)((long)list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    bVar1 = false;
  }
  else {
    lVar4 = 0x20;
    bVar1 = false;
    for (uVar8 = 1;
        uVar8 < (ulong)((long)list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar8 = uVar8 + 1) {
      if (uVar8 != 1) {
        ::std::__cxx11::string::append((char *)&path_1);
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((list.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar4),"*");
      if (bVar2) break;
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((list.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar4),"*\'");
      bVar2 = true;
      if (bVar3) {
LAB_00379f68:
        bVar1 = true;
        goto LAB_00379f70;
      }
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((list.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar4),"*h");
      if (bVar3) goto LAB_00379f68;
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((list.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar4),"*H");
      if (bVar3) goto LAB_00379f68;
      ::std::__cxx11::string::append((string *)&path_1);
      lVar5 = ::std::__cxx11::string::find
                        ((char *)((long)&((list.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar4),0x4aff2f);
      bVar2 = true;
      if (lVar5 == -1) {
        lVar5 = ::std::__cxx11::string::find
                          ((char *)((long)&((list.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar4),0x4aff32);
        if (lVar5 == -1) {
          lVar5 = ::std::__cxx11::string::find
                            ((char *)((long)&((list.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar4),0x4b1837);
          if (lVar5 == -1) {
            uVar6 = strtoul(*(char **)((long)&((list.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar4),(char **)0x0,0);
            bVar2 = (bool)(0x7fffffff < uVar6 | bVar1);
          }
        }
      }
      bVar1 = bVar2;
      lVar4 = lVar4 + 0x20;
    }
    bVar2 = false;
LAB_00379f70:
    if (uVar8 + 1 <
        (ulong)((long)list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      path._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
      path._M_string_length._0_4_ = 0x4c6;
      path.field_2._M_allocated_capacity = (long)"AnalyzeBip32KeyData" + 0xc;
      logger::warn<>((CfdSourceLocation *)&path,
                     "Failed to extkey path. A \'*\' can only be specified at the end.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&path,"Failed to extkey path. A \'*\' can only be specified at the end.",
                 (allocator *)&base_extkey_);
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&path);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    lVar4 = ::std::__cxx11::string::find
                      ((char *)(list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1),0x409b20);
    if (lVar4 != -1) {
      if (child_num < 0) {
        path._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
        path._M_string_length._0_4_ = 0x4d1;
        path.field_2._M_allocated_capacity = (long)"AnalyzeBip32KeyData" + 0xc;
        logger::warn<>((CfdSourceLocation *)&path,"Failed to extkey path. A \'*\' can not support.")
        ;
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&path,"Failed to extkey path. A \'*\' can not support.",
                   (allocator *)&base_extkey_);
        CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&path);
        __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::to_string(&path,child_num);
      ::std::__cxx11::string::append((string *)&path_1);
      ::std::__cxx11::string::~string((string *)&path);
      if (bVar2) {
        ::std::__cxx11::string::append((char *)&path_1);
      }
    }
  }
  base_extkey_._M_dataplus._M_p = (pointer)&base_extkey_.field_2;
  base_extkey_._M_string_length = 0;
  base_extkey_.field_2._M_local_buf[0] = '\0';
  bVar2 = ::std::operator==(&hdkey_top,"prv");
  if (bVar2) {
    ExtPrivkey::ExtPrivkey((ExtPrivkey *)&path,&key);
    ExtPrivkey::operator=(this_01,(ExtPrivkey *)&path);
    ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&path);
    if (path_1._M_string_length != 0) {
      ExtPrivkey::DerivePrivkey((ExtPrivkey *)&path,this_01,&path_1);
      ExtPrivkey::operator=(this_01,(ExtPrivkey *)&path);
      ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&path);
    }
    ExtPrivkey::GetExtPubkey((ExtPubkey *)&path,this_01);
    ExtPubkey::operator=(this_02,(ExtPubkey *)&path);
    ExtPubkey::~ExtPubkey((ExtPubkey *)&path);
    Privkey::Privkey((Privkey *)&path,&(this->extprivkey_).privkey_);
    Privkey::operator=(this_00,(Privkey *)&path);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&path);
    Privkey::GetPubkey((Pubkey *)&path,this_00);
  }
  else {
    if (bVar1) {
      path._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
      path._M_string_length._0_4_ = 0x4e6;
      path.field_2._M_allocated_capacity = (long)"AnalyzeBip32KeyData" + 0xc;
      logger::warn<>((CfdSourceLocation *)&path,"Failed to extPubkey. hardened is extPrivkey only.")
      ;
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&path,"Failed to extPubkey. hardened is extPrivkey only.",
                 (allocator *)&path_list);
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&path);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::ExtPubkey((ExtPubkey *)&path,&key);
    ExtPubkey::operator=(this_02,(ExtPubkey *)&path);
    ExtPubkey::~ExtPubkey((ExtPubkey *)&path);
    if (path_1._M_string_length != 0) {
      ExtPubkey::DerivePubkey((ExtPubkey *)&path,this_02,&path_1);
      ExtPubkey::operator=(this_02,(ExtPubkey *)&path);
      ExtPubkey::~ExtPubkey((ExtPubkey *)&path);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&path,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).pubkey_)
    ;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&path);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&path);
  if (path_1._M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&path,"KeyData",&local_1c1);
    ToArrayFromString(&path_list,&path_1,&path,'\0');
    ::std::__cxx11::string::~string((string *)&path);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (__result,((long)path_list.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)path_list.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2) +
                        ((long)(this->path_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->path_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2));
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_int*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (path_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               path_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               __result);
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&path_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  ::std::__cxx11::string::~string((string *)&base_extkey_);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  ::std::__cxx11::string::~string((string *)&key);
  ::std::__cxx11::string::~string((string *)&path_1);
LAB_0037a362:
  ::std::__cxx11::string::~string((string *)&hdkey_top);
  ::std::__cxx11::string::~string((string *)&key_info);
  return;
}

Assistant:

KeyData::KeyData(
    const std::string& path_info, int32_t child_num, bool has_schnorr_pubkey) {
  auto key_info = path_info;
  if (path_info[0] == '[') {
    // key origin information check. cut to ']'
    auto pos = path_info.find("]");
    if (pos != std::string::npos) {
      key_info = path_info.substr(pos + 1);
      auto path = path_info.substr(1, pos - 1);
      pos = path.find("/");
      if (pos != std::string::npos) {
        if (pos != 0) {
          auto fingerprint = path.substr(0, pos);
          fingerprint_ = ByteData(fingerprint);
        }
        auto child_path = path.substr(pos + 1);
        path_ = ToArrayFromString(child_path, "KeyData", 0);
      }
    }
  }
  // derive key check (xpub,etc)D
  std::string hdkey_top;
  if (key_info.size() > 4) hdkey_top = key_info.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::string path;
    std::string key;
    bool has_end_any_hardened = false;
    bool exist_hardened = false;
    std::vector<std::string> list = StringUtil::Split(key_info, "/");
    key = list[0];
    if (list.size() > 1) {
      size_t index;
      for (index = 1; index < list.size(); ++index) {
        if (index != 1) path += "/";
        if (list[index] == "*") break;
        if ((list[index] == "*'") || (list[index] == "*h") ||
            (list[index] == "*H")) {
          has_end_any_hardened = true;
          exist_hardened = true;
          break;
        }
        path += list[index];
        if ((list[index].find("'") != std::string::npos) ||
            (list[index].find("h") != std::string::npos) ||
            (list[index].find("H") != std::string::npos)) {
          exist_hardened = true;
        } else {
          auto value = strtoul(list[index].c_str(), nullptr, 0);
          if (value >= 0x80000000) exist_hardened = true;
        }
      }
      if ((index + 1) < list.size()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
      }
      if (list.back().find("*") != std::string::npos) {
        if (child_num < 0) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to extkey path. "
              "A '*' can not support.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to extkey path. "
              "A '*' can not support.");
        }
        path += std::to_string(child_num);
        if (has_end_any_hardened) path += "h";
      }
    }
    std::string base_extkey_;
    if (hdkey_top == "prv") {
      extprivkey_ = ExtPrivkey(key);
      if (!path.empty()) extprivkey_ = extprivkey_.DerivePrivkey(path);
      extpubkey_ = extprivkey_.GetExtPubkey();
      privkey_ = extprivkey_.GetPrivkey();
      pubkey_ = privkey_.GetPubkey();
    } else if (exist_hardened) {
      warn(
          CFD_LOG_SOURCE, "Failed to extPubkey. hardened is extPrivkey only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to extPubkey. hardened is extPrivkey only.");
    } else {
      extpubkey_ = ExtPubkey(key);
      if (!path.empty()) extpubkey_ = extpubkey_.DerivePubkey(path);
      pubkey_ = extpubkey_.GetPubkey();
    }
    if (!path.empty()) {
      auto path_list = ToArrayFromString(path, "KeyData", 0);
      path_.reserve(path_.size() + path_list.size());
      std::copy(path_list.begin(), path_list.end(), std::back_inserter(path_));
    }
  } else if (Privkey::HasWif(key_info)) {
    privkey_ = Privkey::FromWif(key_info);
    pubkey_ = privkey_.GetPubkey();
  } else {
    ByteData bytes(key_info);
    if (Pubkey::IsValid(bytes)) {
      pubkey_ = Pubkey(bytes);
    } else if (has_schnorr_pubkey) {
      SchnorrPubkey schnorr_pubkey(bytes);
      pubkey_ = schnorr_pubkey.CreatePubkey();
    } else {
      privkey_ = Privkey(bytes);
      pubkey_ = privkey_.GetPubkey();
    }
  }
}